

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v11::detail::format_float<double>
              (double value,int precision,format_specs *specs,bool binary32,buffer<char> *buf)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  basic_fp<unsigned___int128> value_00;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  format_error *this;
  char32_t cVar13;
  undefined7 in_register_00000011;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int k;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  size_t sVar23;
  bool bVar24;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  uint128_fallback uVar28;
  int exp;
  int local_8c;
  double local_88;
  undefined4 local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  format_specs *local_60;
  ulong local_58;
  undefined8 uStack_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  
  uVar15 = (specs->super_basic_specs).data_ & 7;
  if ((value == 0.0) && (!NAN(value))) {
    if (precision < 1 || uVar15 != 2) {
      uVar16 = buf->size_ + 1;
      if (buf->capacity_ < uVar16) {
        (*buf->grow_)(buf,uVar16);
      }
      sVar23 = buf->size_;
      buf->size_ = sVar23 + 1;
      buf->ptr_[sVar23] = '0';
      return 0;
    }
    uVar16 = (ulong)(uint)precision;
    if (buf->capacity_ < uVar16) {
      (*buf->grow_)(buf,uVar16);
    }
    uVar17 = buf->capacity_;
    if (uVar16 < buf->capacity_) {
      uVar17 = uVar16;
    }
    buf->size_ = uVar17;
    memset(buf->ptr_,0x30,uVar16);
    return -precision;
  }
  local_70 = (ulong)value & 0xfffffffffffff;
  local_68 = (ulong)value & 0x7ff0000000000000;
  local_78 = local_68 >> 0x34;
  local_7c = (undefined4)CONCAT71(in_register_00000011,binary32);
  if (local_68 == 0) {
    uVar16 = 0x3f;
    if (local_70 != 0) {
      for (; local_70 >> uVar16 == 0; uVar16 = uVar16 - 1) {
      }
    }
    iVar10 = -0x427 - (int)(uVar16 ^ 0x3f);
    lVar21 = local_70 << ((char)(uVar16 ^ 0x3f) - 10U & 0x3f);
  }
  else {
    iVar10 = (uint)(local_68 >> 0x34) - 0x433;
    lVar21 = local_70 * 2 + 0x20000000000000;
  }
  local_8c = iVar10 * 0x4d105 >> 0x14;
  k = 2 - local_8c;
  local_8c = local_8c + -2;
  uVar16 = lVar21 << ((char)((uint)(k * 0x1a934f) >> 0x13) + (char)iVar10 & 0x3fU);
  local_88 = value;
  local_60 = specs;
  uVar28 = dragonbox::cache_accessor<double>::get_cached_power(k);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar16;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar28.hi_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar16;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar28.lo_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar3 * auVar7,8);
  auVar8 = auVar2 * auVar6 + auVar8;
  lVar21 = auVar8._0_8_;
  uVar17 = auVar8._8_8_;
  uVar16 = uVar17 * 10;
  if (999999999999999999 < uVar17) {
    uVar16 = uVar17;
  }
  uVar22 = 999999999999999999 < uVar17 | 0x12;
  if (uVar15 == 2) {
    uVar11 = local_8c + uVar22;
    if ((int)(uVar11 ^ 0x7fffffff) < precision && 0 < (int)uVar11) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::runtime_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
    }
    precision = uVar11 + precision;
  }
  uVar26 = SUB84(local_88,0);
  uVar27 = (undefined4)((ulong)local_88 >> 0x20);
  uVar11 = precision;
  if (uVar22 - precision == 0 || (int)uVar22 < precision) {
    local_8c = local_8c + uVar22 + -1;
    goto LAB_00459360;
  }
  if (precision < 1) {
    local_8c = local_8c + uVar22;
    if (precision < 0) {
      buf->size_ = 0;
    }
    else {
      if (buf->capacity_ == 0) {
        (*buf->grow_)(buf,1);
        uVar26 = SUB84(local_88,0);
        uVar27 = (undefined4)((ulong)local_88 >> 0x20);
      }
      buf->size_ = (ulong)(buf->capacity_ != 0);
      if ((uVar16 | lVar21 != 0) < 0x4563918244f40001) {
        *buf->ptr_ = '0';
      }
      else {
        *buf->ptr_ = '1';
      }
    }
    goto LAB_00459360;
  }
  local_8c = local_8c + (uVar22 - precision);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar16;
  uVar17 = SUB168(auVar4 * ZEXT816(0x6df37f675ef6eae0),8) >> 0x20;
  uVar18 = 9;
  if (precision < 9) {
    uVar18 = (ulong)(uint)precision;
  }
  pcVar1 = buf->ptr_;
  if ((uVar18 & 1) == 0) {
    uVar14 = (uVar17 * 0x1ad7f29b >> 0x14) + 1;
    uVar12 = uVar14 >> 0x20;
    *(undefined2 *)pcVar1 = *(undefined2 *)(digits2(unsigned_long)::data + uVar12 * 2);
    uVar11 = 2;
  }
  else {
    uVar14 = (uVar17 * 0x2af31dc5 >> 0x18) + 1;
    uVar12 = uVar14 >> 0x20;
    *pcVar1 = (char)(uVar14 >> 0x20) + '0';
    uVar11 = 1;
  }
  if ((int)uVar11 < precision) {
    uVar20 = (ulong)uVar11;
    do {
      uVar14 = (uVar14 & 0xffffffff) * 100;
      uVar12 = uVar14 >> 0x20;
      *(undefined2 *)(pcVar1 + uVar20) = *(undefined2 *)(digits2(unsigned_long)::data + uVar12 * 2);
      uVar20 = uVar20 + 2;
    } while (uVar20 < uVar18);
  }
  bVar9 = (byte)uVar12;
  uVar16 = uVar17 * -10000000000 + uVar16;
  if (precision < 10) {
    if (precision != 9) {
      cVar13 = (char32_t)uVar14;
      if ((uint)cVar13 < (uint)anon_var_dwarf_1a7a60a[8 - (int)uVar18]) {
        uVar11 = (uint)uVar12 | (uint)(uVar16 != 0 || lVar21 != 0);
LAB_004592ad:
        uVar11 = uVar11 & (uint)cVar13 >> 0x1f;
LAB_004592c3:
        uVar16 = (ulong)(uint)precision;
        if ((uVar11 & 1) == 0) goto LAB_00459339;
      }
      goto LAB_004592ca;
    }
    bVar24 = uVar16 == 5000000000;
    if (5000000000 < uVar16) goto LAB_004592ca;
LAB_004592b6:
    uVar16 = (ulong)(uint)precision;
    if (bVar24) {
      uVar11 = (uint)(bVar9 | lVar21 != 0);
      goto LAB_004592c3;
    }
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar16;
    uVar11 = precision - 9;
    pcVar1 = buf->ptr_;
    uVar17 = SUB168(auVar5 * ZEXT816(0x199999999999999a),8) & 0xffffffff;
    if ((uVar11 & 1) == 0) {
      uVar18 = (uVar17 * 0x1ad7f29b >> 0x14) + 1;
      uVar17 = uVar18 >> 0x20;
      *(undefined2 *)(pcVar1 + 9) = *(undefined2 *)(digits2(unsigned_long)::data + uVar17 * 2);
      uVar19 = 2;
    }
    else {
      uVar18 = (uVar17 * 0x2af31dc5 >> 0x18) + 1;
      uVar17 = uVar18 >> 0x20;
      pcVar1[9] = (char)(uVar18 >> 0x20) + '0';
      uVar19 = 1;
    }
    if ((int)uVar19 < (int)uVar11) {
      uVar12 = (ulong)uVar19;
      do {
        uVar18 = (uVar18 & 0xffffffff) * 100;
        uVar17 = uVar18 >> 0x20;
        *(undefined2 *)(pcVar1 + uVar12 + 9) =
             *(undefined2 *)(digits2(unsigned_long)::data + uVar17 * 2);
        uVar12 = uVar12 + 2;
      } while ((long)uVar12 < (long)(int)uVar11);
    }
    bVar9 = (byte)uVar17;
    uVar11 = (int)uVar16 + SUB164(auVar5 * ZEXT816(0x199999999999999a),8) * -10;
    if (precision < 0x12) {
      cVar13 = (char32_t)uVar18;
      if ((uint)cVar13 < (uint)anon_var_dwarf_1a7a60a[0x11 - precision]) {
        uVar11 = (uint)uVar17 | (uint)(uVar11 != 0 || lVar21 != 0);
        goto LAB_004592ad;
      }
    }
    else {
      bVar24 = uVar11 == 5;
      if (uVar11 < 6) goto LAB_004592b6;
    }
LAB_004592ca:
    uVar17 = (ulong)(uint)precision;
    buf->ptr_[uVar17 - 1] = buf->ptr_[uVar17 - 1] + '\x01';
    if (precision != 1) {
      lVar21 = uVar17 + 1;
      do {
        if (buf->ptr_[lVar21 + -2] < ':') break;
        buf->ptr_[lVar21 + -2] = '0';
        buf->ptr_[lVar21 + -3] = buf->ptr_[lVar21 + -3] + '\x01';
        lVar21 = lVar21 + -1;
      } while (2 < lVar21);
    }
    uVar16 = (ulong)(uint)precision;
    if ('9' < *buf->ptr_) {
      *buf->ptr_ = '1';
      if (uVar15 == 2) {
        uVar16 = (ulong)(precision + 1);
        buf->ptr_[uVar17] = '0';
      }
      else {
        local_8c = local_8c + 1;
        uVar16 = (ulong)(uint)precision;
      }
    }
  }
LAB_00459339:
  if (buf->capacity_ < uVar16) {
    (*buf->grow_)(buf,uVar16);
    uVar26 = SUB84(local_88,0);
    uVar27 = (undefined4)((ulong)local_88 >> 0x20);
  }
  uVar17 = buf->capacity_;
  if (uVar16 < buf->capacity_) {
    uVar17 = uVar16;
  }
  buf->size_ = uVar17;
  uVar11 = (uint)uVar16;
LAB_00459360:
  if ((int)uVar22 <= precision) {
    if ((char)local_7c == '\0') {
      local_58 = local_70 | 0x10000000000000;
      if (local_68 == 0) {
        local_58 = local_70;
      }
      local_48 = -0x432;
      if (local_68 != 0) {
        local_48 = (int)local_78 + -0x433;
      }
      bVar25 = local_70 == 0;
      bVar24 = local_68 >> 0x35 != 0;
    }
    else {
      uVar19 = (uint)(float)(double)CONCAT44(uVar27,uVar26) & 0x7fffff;
      uVar22 = (uint)(float)(double)CONCAT44(uVar27,uVar26) & 0x7f800000;
      local_58 = (ulong)uVar19 + 0x800000;
      if (uVar22 == 0) {
        local_58 = (ulong)uVar19;
      }
      local_48 = -0x95;
      if (uVar22 != 0) {
        local_48 = (uVar22 >> 0x17) - 0x96;
      }
      bVar25 = uVar19 == 0;
      bVar24 = 0xffffff < uVar22;
    }
    uVar22 = (byte)(bVar24 & bVar25) + 4;
    if (uVar15 != 2) {
      uVar22 = (uint)(byte)(bVar24 & bVar25);
    }
    uVar19 = 0x2ff;
    if ((int)uVar11 < 0x2ff) {
      uVar19 = uVar11;
    }
    uStack_50 = 0;
    value_00._20_4_ = uStack_44;
    value_00.e = local_48;
    value_00.f._8_8_ = 0;
    value_00.f._0_8_ = local_58;
    value_00._24_8_ = uStack_40;
    format_dragon(value_00,uVar22,uVar19,buf,&local_8c);
  }
  if ((uVar15 != 2) && (((local_60->super_basic_specs).data_ & 0x2000) == 0)) {
    sVar23 = buf->size_;
    if (sVar23 != 0) {
      do {
        iVar10 = local_8c + 1;
        if (buf->ptr_[sVar23 - 1] != '0') goto LAB_00459484;
        sVar23 = sVar23 - 1;
        local_8c = iVar10;
      } while (sVar23 != 0);
      sVar23 = 0;
    }
LAB_00459484:
    if (buf->capacity_ < sVar23) {
      (*buf->grow_)(buf,sVar23);
    }
    uVar16 = buf->capacity_;
    if (sVar23 < buf->capacity_) {
      uVar16 = sVar23;
    }
    buf->size_ = uVar16;
  }
  return local_8c;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision,
                                  const format_specs& specs, bool binary32,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  auto converted_value = convert_float(value);

  const bool fixed = specs.type() == presentation_type::fixed;
  if (value == 0) {
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>() || is_constant_evaluated()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    auto e = (f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10;
    exp = static_cast<int>(e);
    if (e > exp) ++exp;  // Compute ceil.
    dragon_flags = dragon::fixup;
  } else {
    // Extract significand bits and exponent bits.
    using info = dragonbox::float_info<double>;
    auto br = bit_cast<uint64_t>(static_cast<double>(value));

    const uint64_t significand_mask =
        (static_cast<uint64_t>(1) << num_significand_bits<double>()) - 1;
    uint64_t significand = (br & significand_mask);
    int exponent = static_cast<int>((br & exponent_mask<double>()) >>
                                    num_significand_bits<double>());

    if (exponent != 0) {  // Check if normal.
      exponent -= exponent_bias<double>() + num_significand_bits<double>();
      significand |=
          (static_cast<uint64_t>(1) << num_significand_bits<double>());
      significand <<= 1;
    } else {
      // Normalize subnormal inputs.
      FMT_ASSERT(significand != 0, "zeros should not appear here");
      int shift = countl_zero(significand);
      FMT_ASSERT(shift >= num_bits<uint64_t>() - num_significand_bits<double>(),
                 "");
      shift -= (num_bits<uint64_t>() - num_significand_bits<double>() - 2);
      exponent = (std::numeric_limits<double>::min_exponent -
                  num_significand_bits<double>()) -
                 shift;
      significand <<= shift;
    }

    // Compute the first several nonzero decimal significand digits.
    // We call the number we get the first segment.
    const int k = info::kappa - dragonbox::floor_log10_pow2(exponent);
    exp = -k;
    const int beta = exponent + dragonbox::floor_log2_pow10(k);
    uint64_t first_segment;
    bool has_more_segments;
    int digits_in_the_first_segment;
    {
      const auto r = dragonbox::umul192_upper128(
          significand << beta, dragonbox::get_cached_power(k));
      first_segment = r.high();
      has_more_segments = r.low() != 0;

      // The first segment can have 18 ~ 19 digits.
      if (first_segment >= 1000000000000000000ULL) {
        digits_in_the_first_segment = 19;
      } else {
        // When it is of 18-digits, we align it to 19-digits by adding a bogus
        // zero at the end.
        digits_in_the_first_segment = 18;
        first_segment *= 10;
      }
    }

    // Compute the actual number of decimal digits to print.
    if (fixed) adjust_precision(precision, exp + digits_in_the_first_segment);

    // Use Dragon4 only when there might be not enough digits in the first
    // segment.
    if (digits_in_the_first_segment > precision) {
      use_dragon = false;

      if (precision <= 0) {
        exp += digits_in_the_first_segment;

        if (precision < 0) {
          // Nothing to do, since all we have are just leading zeros.
          buf.try_resize(0);
        } else {
          // We may need to round-up.
          buf.try_resize(1);
          if ((first_segment | static_cast<uint64_t>(has_more_segments)) >
              5000000000000000000ULL) {
            buf[0] = '1';
          } else {
            buf[0] = '0';
          }
        }
      }  // precision <= 0
      else {
        exp += digits_in_the_first_segment - precision;

        // When precision > 0, we divide the first segment into three
        // subsegments, each with 9, 9, and 0 ~ 1 digits so that each fits
        // in 32-bits which usually allows faster calculation than in
        // 64-bits. Since some compiler (e.g. MSVC) doesn't know how to optimize
        // division-by-constant for large 64-bit divisors, we do it here
        // manually. The magic number 7922816251426433760 below is equal to
        // ceil(2^(64+32) / 10^10).
        const uint32_t first_subsegment = static_cast<uint32_t>(
            dragonbox::umul128_upper64(first_segment, 7922816251426433760ULL) >>
            32);
        const uint64_t second_third_subsegments =
            first_segment - first_subsegment * 10000000000ULL;

        uint64_t prod;
        uint32_t digits;
        bool should_round_up;
        int number_of_digits_to_print = min_of(precision, 9);

        // Print a 9-digits subsegment, either the first or the second.
        auto print_subsegment = [&](uint32_t subsegment, char* buffer) {
          int number_of_digits_printed = 0;

          // If we want to print an odd number of digits from the subsegment,
          if ((number_of_digits_to_print & 1) != 0) {
            // Convert to 64-bit fixed-point fractional form with 1-digit
            // integer part. The magic number 720575941 is a good enough
            // approximation of 2^(32 + 24) / 10^8; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(720575941)) >> 24) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            *buffer = static_cast<char>('0' + digits);
            number_of_digits_printed++;
          }
          // If we want to print an even number of digits from the
          // first_subsegment,
          else {
            // Convert to 64-bit fixed-point fractional form with 2-digits
            // integer part. The magic number 450359963 is a good enough
            // approximation of 2^(32 + 20) / 10^7; see
            // https://jk-jeon.github.io/posts/2022/12/fixed-precision-formatting/#fixed-length-case
            // for details.
            prod = ((subsegment * static_cast<uint64_t>(450359963)) >> 20) + 1;
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer, digits);
            number_of_digits_printed += 2;
          }

          // Print all digit pairs.
          while (number_of_digits_printed < number_of_digits_to_print) {
            prod = static_cast<uint32_t>(prod) * static_cast<uint64_t>(100);
            digits = static_cast<uint32_t>(prod >> 32);
            write2digits(buffer + number_of_digits_printed, digits);
            number_of_digits_printed += 2;
          }
        };

        // Print first subsegment.
        print_subsegment(first_subsegment, buf.data());

        // Perform rounding if the first subsegment is the last subsegment to
        // print.
        if (precision <= 9) {
          // Rounding inside the subsegment.
          // We round-up if:
          //  - either the fractional part is strictly larger than 1/2, or
          //  - the fractional part is exactly 1/2 and the last digit is odd.
          // We rely on the following observations:
          //  - If fractional_part >= threshold, then the fractional part is
          //    strictly larger than 1/2.
          //  - If the MSB of fractional_part is set, then the fractional part
          //    must be at least 1/2.
          //  - When the MSB of fractional_part is set, either
          //    second_third_subsegments being nonzero or has_more_segments
          //    being true means there are further digits not printed, so the
          //    fractional part is strictly larger than 1/2.
          if (precision < 9) {
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (second_third_subsegments != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          // In this case, the fractional part is at least 1/2 if and only if
          // second_third_subsegments >= 5000000000ULL, and is strictly larger
          // than 1/2 if we further have either second_third_subsegments >
          // 5000000000ULL or has_more_segments == true.
          else {
            should_round_up = second_third_subsegments > 5000000000ULL ||
                              (second_third_subsegments == 5000000000ULL &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }
        // Otherwise, print the second subsegment.
        else {
          // Compilers are not aware of how to leverage the maximum value of
          // second_third_subsegments to find out a better magic number which
          // allows us to eliminate an additional shift. 1844674407370955162 =
          // ceil(2^64/10) < ceil(2^64*(10^9/(10^10 - 1))).
          const uint32_t second_subsegment =
              static_cast<uint32_t>(dragonbox::umul128_upper64(
                  second_third_subsegments, 1844674407370955162ULL));
          const uint32_t third_subsegment =
              static_cast<uint32_t>(second_third_subsegments) -
              second_subsegment * 10;

          number_of_digits_to_print = precision - 9;
          print_subsegment(second_subsegment, buf.data() + 9);

          // Rounding inside the subsegment.
          if (precision < 18) {
            // The condition third_subsegment != 0 implies that the segment was
            // of 19 digits, so in this case the third segment should be
            // consisting of a genuine digit from the input.
            uint32_t fractional_part = static_cast<uint32_t>(prod);
            should_round_up =
                fractional_part >= fractional_part_rounding_thresholds(
                                       8 - number_of_digits_to_print) ||
                ((fractional_part >> 31) &
                 ((digits & 1) | (third_subsegment != 0) |
                  has_more_segments)) != 0;
          }
          // Rounding at the subsegment boundary.
          else {
            // In this case, the segment must be of 19 digits, thus
            // the third subsegment should be consisting of a genuine digit from
            // the input.
            should_round_up = third_subsegment > 5 ||
                              (third_subsegment == 5 &&
                               ((digits & 1) != 0 || has_more_segments));
          }
        }

        // Round-up if necessary.
        if (should_round_up) {
          ++buf[precision - 1];
          for (int i = precision - 1; i > 0 && buf[i] > '9'; --i) {
            buf[i] = '0';
            ++buf[i - 1];
          }
          if (buf[0] > '9') {
            buf[0] = '1';
            if (fixed)
              buf[precision++] = '0';
            else
              ++exp;
          }
        }
        buf.try_resize(to_unsigned(precision));
      }
    }  // if (digits_in_the_first_segment > precision)
    else {
      // Adjust the exponent for its use in Dragon4.
      exp += digits_in_the_first_segment - 1;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = binary32 ? f.assign(static_cast<float>(value))
                                          : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.alt()) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}